

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::RandomDelayFilterOperation::set
          (RandomDelayFilterOperation *this,string_view property,double val)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  bool bVar1;
  pointer pRVar2;
  size_t in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  double in_XMM0_Qa;
  char *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  __x._M_str = in_stack_ffffffffffffff10;
  __x._M_len = in_stack_ffffffffffffff08;
  __y._M_str = in_stack_ffffffffffffff00;
  __y._M_len = in_stack_fffffffffffffef8;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    __x_00._M_str = in_stack_ffffffffffffff10;
    __x_00._M_len = in_stack_ffffffffffffff08;
    __y_00._M_str = in_stack_ffffffffffffff00;
    __y_00._M_len = in_stack_fffffffffffffef8;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      __x_01._M_str = in_stack_ffffffffffffff10;
      __x_01._M_len = in_stack_ffffffffffffff08;
      __y_01._M_str = in_stack_ffffffffffffff00;
      __y_01._M_len = in_stack_fffffffffffffef8;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        __x_02._M_str = in_stack_ffffffffffffff10;
        __x_02._M_len = in_stack_ffffffffffffff08;
        __y_02._M_str = in_stack_ffffffffffffff00;
        __y_02._M_len = in_stack_fffffffffffffef8;
        bVar1 = std::operator==(__x_02,__y_02);
        if (!bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          __x_03._M_str = in_stack_ffffffffffffff10;
          __x_03._M_len = in_stack_ffffffffffffff08;
          __y_03._M_str = in_stack_ffffffffffffff00;
          __y_03._M_len = in_stack_fffffffffffffef8;
          bVar1 = std::operator==(__x_03,__y_03);
          if (!bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
            __x_04._M_str = in_stack_ffffffffffffff10;
            __x_04._M_len = in_stack_ffffffffffffff08;
            __y_04._M_str = in_stack_ffffffffffffff00;
            __y_04._M_len = in_stack_fffffffffffffef8;
            bVar1 = std::operator==(__x_04,__y_04);
            if (!bVar1) {
              pbVar3 = in_RSI;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
              __x_05._M_str = (char *)pbVar3;
              __x_05._M_len = in_stack_ffffffffffffff08;
              __y_05._M_str = in_stack_ffffffffffffff00;
              __y_05._M_len = in_stack_fffffffffffffef8;
              bVar1 = std::operator==(__x_05,__y_05);
              if (!bVar1) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_RSI,in_stack_fffffffffffffee8);
                __x_06._M_str = (char *)pbVar3;
                __x_06._M_len = in_stack_ffffffffffffff08;
                __y_06._M_str = in_stack_ffffffffffffff00;
                __y_06._M_len = in_RDX;
                bVar1 = std::operator==(__x_06,__y_06);
                if (!bVar1) {
                  return;
                }
              }
            }
          }
          pRVar2 = std::
                   unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                   ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                                 *)0x2d83bb);
          std::__atomic_float<double>::store
                    (&(pRVar2->param2).super___atomic_float<double>,in_XMM0_Qa,seq_cst);
          return;
        }
      }
    }
  }
  pRVar2 = std::
           unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
           ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                         *)0x2d825f);
  std::__atomic_float<double>::store
            (&(pRVar2->param1).super___atomic_float<double>,in_XMM0_Qa,seq_cst);
  return;
}

Assistant:

void RandomDelayFilterOperation::set(std::string_view property, double val)
{
    if ((property == "param1") || (property == "mean") || (property == "min") ||
        (property == "alpha")) {
        rdelayGen->param1.store(val);
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        rdelayGen->param2.store(val);
    }
}